

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O1

char * makesingular(char *oldstr)

{
  char *__s1;
  char *pcVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *str;
  
  iVar3 = nextobuf_bufidx + 1 >> 0x1f;
  nextobuf_bufidx =
       nextobuf_bufidx + (((uint)((nextobuf_bufidx + 1) / 6 + iVar3) >> 1) - iVar3) * -0xc + 1;
  pcVar4 = nextobuf_bufs + (long)nextobuf_bufidx * 0x100;
  if ((oldstr == (char *)0x0) || (*oldstr == '\0')) {
    warning("singular of null?");
    *pcVar4 = '\0';
    return pcVar4;
  }
  strcpy(pcVar4,oldstr);
  do {
    str = pcVar4;
    pcVar4 = str + 1;
  } while (*str == ' ');
  pcVar4 = strstri(str,"s of ");
  if (pcVar4 != (char *)0x0) {
    if ((str <= pcVar4 + -3) && (iVar3 = strncasecmp(pcVar4 + -3,"Eye",3), iVar3 == 0)) {
      return str;
    }
    if ((str <= pcVar4 + -4) && (iVar3 = strncmp(pcVar4 + -4,"boot",4), iVar3 == 0)) {
      return str;
    }
    if ((str <= pcVar4 + -8) && (iVar3 = strncmp(pcVar4 + -8,"gauntlet",8), iVar3 == 0)) {
      return str;
    }
    do {
      cVar2 = pcVar4[1];
      *pcVar4 = cVar2;
      pcVar4 = pcVar4 + 1;
    } while (cVar2 != '\0');
    return str;
  }
  pcVar4 = eos(str);
  if ((pcVar4 < str + 1) || (pcVar4[-1] != 's')) {
    pcVar5 = pcVar4 + -5;
    if (pcVar5 < str) {
      return str;
    }
    iVar3 = strcmp(pcVar5,"teeth");
    if (iVar3 != 0) {
      iVar3 = strcmp(pcVar5,"fungi");
      if (iVar3 != 0) {
        return str;
      }
      builtin_strncpy(pcVar4 + -5,"fungus",7);
      return str;
    }
    builtin_strncpy(pcVar4 + -5,"tooth",6);
    return str;
  }
  if ((pcVar4 < str + 2) || (pcVar4[-2] != 'e')) {
    pcVar5 = pcVar4 + -5;
    if ((str <= pcVar5) && (iVar3 = strcmp(pcVar5,"boots"), iVar3 == 0)) {
      return str;
    }
    pcVar1 = pcVar4 + -9;
    if ((str <= pcVar1) && (iVar3 = strcmp(pcVar1,"gauntlets"), iVar3 == 0)) {
      return str;
    }
    __s1 = pcVar4 + -6;
    if ((str <= __s1) && (iVar3 = strcmp(__s1,"tricks"), iVar3 == 0)) {
      return str;
    }
    if ((str <= pcVar1) && (iVar3 = strcmp(pcVar1,"paralysis"), iVar3 == 0)) {
      return str;
    }
    if ((str <= pcVar5) && (iVar3 = strcmp(pcVar5,"glass"), iVar3 == 0)) {
      return str;
    }
    if ((str <= pcVar4 + -4) && (iVar3 = strcmp(pcVar4 + -4,"ness"), iVar3 == 0)) {
      return str;
    }
    if ((str <= pcVar4 + -0xe) && (iVar3 = strcmp(pcVar4 + -0xe,"shape changers"), iVar3 == 0)) {
      return str;
    }
    if ((str <= pcVar4 + -0xf) && (iVar3 = strcmp(pcVar4 + -0xf,"detect monsters"), iVar3 == 0)) {
      return str;
    }
    if ((str <= pcVar4 + -0xb) &&
       (iVar3 = strncasecmp(pcVar4 + -0xb,"Aesculapius",0xffffffffffffffff), iVar3 == 0)) {
      return str;
    }
    if ((str <= pcVar4 + -10) && (iVar3 = strcmp(pcVar4 + -10,"eucalyptus"), iVar3 == 0)) {
      return str;
    }
    if ((str <= __s1) && (iVar3 = strcmp(__s1,"lembas"), iVar3 == 0)) {
      return str;
    }
    if ((str <= pcVar1) && (iVar3 = strcmp(pcVar1,"iron bars"), iVar3 == 0)) {
      return str;
    }
    if ((str <= pcVar5) && (iVar3 = strcmp(pcVar5,"aklys"), iVar3 == 0)) {
      return str;
    }
    if (__s1 < str) goto LAB_001fef2c;
    pcVar5 = "fungus";
  }
  else {
    if ((str + 3 <= pcVar4) && (pcVar4[-3] == 'i')) {
      if (((pcVar4 + -7 < str) || (iVar3 = strcmp(pcVar4 + -7,"cookies"), iVar3 != 0)) &&
         ((pcVar4 + -4 < str || (iVar3 = strcmp(pcVar4 + -4,"pies"), iVar3 != 0)))) {
        pcVar4[-3] = 'y';
        pcVar4[-2] = '\0';
        return str;
      }
      goto LAB_001fef2c;
    }
    pcVar5 = pcVar4 + -6;
    if (str <= pcVar5) {
      iVar3 = strcmp(pcVar5,"knives");
      if (iVar3 == 0) {
        pcVar4[-1] = '\0';
        pcVar4[-3] = 'f';
        pcVar4[-2] = 'e';
        return str;
      }
      iVar3 = strcmp(pcVar5,"staves");
      if (iVar3 == 0) {
        pcVar4[-1] = '\0';
        pcVar4[-3] = 'f';
        pcVar4[-2] = 'f';
        return str;
      }
      iVar3 = strncasecmp(pcVar5,"leaves",0xffffffffffffffff);
      if (iVar3 == 0) {
        pcVar4[-3] = 'f';
        pcVar4[-2] = '\0';
        return str;
      }
    }
    if ((str <= pcVar4 + -8) && (iVar3 = strcmp(pcVar4 + -8,"vortices"), iVar3 == 0)) {
      pcVar4[-2] = '\0';
      pcVar4[-4] = 'e';
      pcVar4[-3] = 'x';
      return str;
    }
    pcVar1 = pcVar4 + -5;
    if (((str <= pcVar1) && (iVar3 = strcmp(pcVar1,"boxes"), iVar3 == 0)) ||
       ((str <= pcVar4 + -4 && (iVar3 = strcmp(pcVar4 + -4,"ches"), iVar3 == 0)))) {
      pcVar4[-2] = '\0';
      return str;
    }
    if (str <= pcVar5) {
      iVar3 = strcmp(pcVar5,"gloves");
      if (iVar3 == 0) {
        return str;
      }
      iVar3 = strcmp(pcVar5,"lenses");
      if (iVar3 == 0) {
        return str;
      }
    }
    if ((str <= pcVar1) && (iVar3 = strcmp(pcVar1,"shoes"), iVar3 == 0)) {
      return str;
    }
    if (pcVar5 < str) goto LAB_001fef2c;
    pcVar5 = "scales";
  }
  iVar3 = strcmp(pcVar4 + -6,pcVar5);
  if (iVar3 == 0) {
    return str;
  }
LAB_001fef2c:
  pcVar4[-1] = '\0';
  return str;
}

Assistant:

char *makesingular(const char *oldstr)
{
	char *p, *bp;
	char *str = nextobuf();

	if (!oldstr || !*oldstr) {
		warning("singular of null?");
		str[0] = 0;
		return str;
	}
	strcpy(str, oldstr);
	bp = str;

	while (*bp == ' ') bp++;
	/* find "cloves of garlic", "worthless pieces of blue glass" */
	if ((p = strstri(bp, "s of ")) != 0) {
	    /* but don't singularize "gauntlets", "boots", "Eyes of the.." */
	    if (BSTRNCMPI(bp, p-3, "Eye", 3) &&
		BSTRNCMP(bp, p-4, "boot", 4) &&
		BSTRNCMP(bp, p-8, "gauntlet", 8))
		while ((*p = *(p+1)) != 0) p++;
	    return bp;
	}

	/* remove -s or -es (boxes) or -ies (rubies) */
	p = eos(bp);
	if (p >= bp+1 && p[-1] == 's') {
		if (p >= bp+2 && p[-2] == 'e') {
			if (p >= bp+3 && p[-3] == 'i') {
				if (!BSTRCMP(bp, p-7, "cookies") ||
				   !BSTRCMP(bp, p-4, "pies"))
					goto mins;
				strcpy(p-3, "y");
				return bp;
			}

			/* note: cloves / knives from clove / knife */
			if (!BSTRCMP(bp, p-6, "knives")) {
				strcpy(p-3, "fe");
				return bp;
			}
			if (!BSTRCMP(bp, p-6, "staves")) {
				strcpy(p-3, "ff");
				return bp;
			}
			if (!BSTRCMPI(bp, p-6, "leaves")) {
				strcpy(p-3, "f");
				return bp;
			}
			if (!BSTRCMP(bp, p-8, "vortices")) {
				strcpy(p-4, "ex");
				return bp;
			}

			/* note: nurses, axes but boxes */
			if (!BSTRCMP(bp, p-5, "boxes") ||
			    !BSTRCMP(bp, p-4, "ches")) {
				p[-2] = '\0';
				return bp;
			}

			if (!BSTRCMP(bp, p-6, "gloves") ||
			    !BSTRCMP(bp, p-6, "lenses") ||
			    !BSTRCMP(bp, p-5, "shoes") ||
			    !BSTRCMP(bp, p-6, "scales"))
				return bp;

		} else if (!BSTRCMP(bp, p-5, "boots") ||
			   !BSTRCMP(bp, p-9, "gauntlets") ||
			   !BSTRCMP(bp, p-6, "tricks") ||
			   !BSTRCMP(bp, p-9, "paralysis") ||
			   !BSTRCMP(bp, p-5, "glass") ||
			   !BSTRCMP(bp, p-4, "ness") ||
			   !BSTRCMP(bp, p-14, "shape changers") ||
			   !BSTRCMP(bp, p-15, "detect monsters") ||
			   !BSTRCMPI(bp, p-11, "Aesculapius") || /* staff */
			   !BSTRCMP(bp, p-10, "eucalyptus") ||
			   !BSTRCMP(bp, p-6, "lembas") ||
			   !BSTRCMP(bp, p-9, "iron bars") ||
			   !BSTRCMP(bp, p-5, "aklys") ||
			   !BSTRCMP(bp, p-6, "fungus"))
				return bp;
	mins:
		p[-1] = '\0';

	} else {

		if (!BSTRCMP(bp, p-5, "teeth")) {
			strcpy(p-5, "tooth");
			return bp;
		}

		if (!BSTRCMP(bp, p-5, "fungi")) {
			strcpy(p-5, "fungus");
			return bp;
		}

		/* here we cannot find the plural suffix */
	}
	return bp;
}